

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bigint * __thiscall duckdb_fmt::v6::internal::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  
  iVar5 = shift + 0x1f;
  if (-1 < shift) {
    iVar5 = shift;
  }
  this->exp_ = this->exp_ + (iVar5 >> 5);
  if ((shift % 0x20 != 0) && (sVar6 = (this->bigits_).super_buffer<unsigned_int>.size_, sVar6 != 0))
  {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    bVar4 = (byte)(shift % 0x20);
    sVar10 = 0;
    uVar7 = 0;
    do {
      uVar1 = puVar2[sVar10];
      bVar3 = 0x20 - bVar4 & 0x1f;
      uVar8 = uVar1 >> bVar3;
      puVar2[sVar10] = (uVar1 << (bVar4 & 0x1f)) + uVar7;
      sVar10 = sVar10 + 1;
      uVar7 = uVar8;
    } while (sVar6 != sVar10);
    if (uVar1 >> bVar3 != 0) {
      uVar9 = sVar6 + 1;
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar9) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
        sVar6 = (this->bigits_).super_buffer<unsigned_int>.size_;
        uVar9 = sVar6 + 1;
      }
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      (this->bigits_).super_buffer<unsigned_int>.size_ = uVar9;
      puVar2[sVar6] = uVar8;
    }
  }
  return this;
}

Assistant:

bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }